

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

void __thiscall
Hospital::Read_From_File_And_Create_Objects<Doctor>
          (Hospital *this,vector<Doctor,_std::allocator<Doctor>_> *All_Of_Humans,fstream *inFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long *plVar4;
  string password;
  string password_00;
  string password_01;
  string age;
  string age_00;
  string age_01;
  string field;
  string field_00;
  string field_01;
  string day;
  string day_00;
  string day_01;
  string time;
  string time_00;
  string time_01;
  string visited_patients;
  string visited_patients_00;
  string visited_patients_01;
  pointer pbVar5;
  pointer pbVar6;
  long lVar7;
  ostream *poVar8;
  int iVar9;
  pointer pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  undefined8 uStack_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined1 *in_stack_fffffffffffff9f8;
  undefined8 in_stack_fffffffffffffa00;
  long in_stack_fffffffffffffa08;
  undefined8 in_stack_fffffffffffffa10;
  string s;
  long *local_5c8 [2];
  long local_5b8 [2];
  long *local_5a8 [2];
  long local_598 [2];
  long *local_588 [2];
  long local_578 [2];
  long *local_568 [2];
  long local_558 [2];
  long *local_548 [2];
  long local_538 [2];
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  long *local_4a8 [2];
  long local_498 [2];
  long *local_488 [2];
  long local_478 [2];
  long *local_468 [2];
  long local_458 [2];
  long *local_448 [2];
  long local_438 [2];
  long *local_428 [2];
  long local_418 [2];
  string local_408;
  string local_3e8;
  string local_3c8;
  long *local_3a8 [2];
  long local_398 [2];
  long *local_388 [2];
  long local_378 [2];
  long *local_368 [2];
  long local_358 [2];
  long *local_348 [2];
  long local_338 [2];
  long *local_328 [2];
  long local_318 [2];
  string local_308;
  string local_2e8;
  string local_2c8;
  long *local_2a8 [2];
  long local_298 [2];
  string local_288;
  long *local_268 [2];
  long local_258 [2];
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string item;
  Doctor New_Nurse;
  
  if (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 5) != 0) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"Error opening file !!! ");
    std::endl<char,std::char_traits<char>>(poVar8);
    exit(1);
  }
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s._M_dataplus._M_p = (pointer)&s.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&s,"6Doctor","");
  if (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 2) == 0) {
    this_00 = &New_Nurse.doctor_all_ino;
    paVar13 = &New_Nurse.Visited_Patients.field_2;
    paVar12 = &New_Nurse.Field.field_2;
    paVar1 = &New_Nurse.Time.field_2;
    paVar2 = &New_Nurse.Day.field_2;
    iVar9 = 0;
    do {
      std::operator>>((istream *)inFile,(string *)&item);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&temp,&item);
      lVar7 = std::__cxx11::string::find((char *)&s,0x12a87d,0);
      if (iVar9 == 9 && lVar7 != -1) {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        pcVar3 = ((temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar3,
                   pcVar3 + (temp.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
        local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2c8,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
        local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e8,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
        local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
        local_328[0] = local_318;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_328,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
        local_348[0] = local_338;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_348,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
        local_368[0] = local_358;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_368,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
        local_388[0] = local_378;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_388,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[8]._M_string_length);
        local_3a8[0] = local_398;
        pcVar3 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[9]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3a8,pcVar3,
                   pcVar3 + temp.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[9]._M_string_length);
        in_stack_fffffffffffff9f8 = &stack0xfffffffffffffa08;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffff9f8,"salam","");
        password._M_string_length = (size_type)local_348;
        password._M_dataplus._M_p = (pointer)local_328;
        password.field_2._M_allocated_capacity = (size_type)local_368;
        password.field_2._8_8_ = local_388;
        age._M_string_length = (size_type)&stack0xfffffffffffff9f8;
        age._M_dataplus._M_p = (pointer)local_3a8;
        age.field_2._M_allocated_capacity =
             (size_type)
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        age.field_2._8_8_ =
             temp.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        field._M_string_length = uStack_640;
        field._M_dataplus._M_p =
             (pointer)temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        field.field_2._M_allocated_capacity = (size_type)paVar2;
        field.field_2._8_8_ = paVar1;
        day._M_string_length = (size_type)paVar13;
        day._M_dataplus._M_p = (pointer)paVar12;
        day.field_2._M_allocated_capacity = (size_type)this_00;
        day.field_2._8_8_ = All_Of_Humans;
        time._M_string_length = in_stack_fffffffffffffa00;
        time._M_dataplus._M_p = in_stack_fffffffffffff9f8;
        time.field_2._M_allocated_capacity = in_stack_fffffffffffffa08;
        time.field_2._8_8_ = in_stack_fffffffffffffa10;
        visited_patients._M_string_length = s._M_string_length;
        visited_patients._M_dataplus._M_p = s._M_dataplus._M_p;
        visited_patients.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity;
        visited_patients.field_2._8_8_ = s.field_2._8_8_;
        Doctor::Doctor(&New_Nurse,&local_1e8,&local_208,&local_2c8,&local_2e8,&local_308,password,
                       age,field,day,time,visited_patients);
        if (in_stack_fffffffffffff9f8 != &stack0xfffffffffffffa08) {
          operator_delete(in_stack_fffffffffffff9f8,in_stack_fffffffffffffa08 + 1);
        }
        if (local_3a8[0] != local_398) {
          operator_delete(local_3a8[0],local_398[0] + 1);
        }
        if (local_388[0] != local_378) {
          operator_delete(local_388[0],local_378[0] + 1);
        }
        if (local_368[0] != local_358) {
          operator_delete(local_368[0],local_358[0] + 1);
        }
        if (local_348[0] != local_338) {
          operator_delete(local_348[0],local_338[0] + 1);
        }
        if (local_328[0] != local_318) {
          operator_delete(local_328[0],local_318[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        std::vector<Doctor,_std::allocator<Doctor>_>::push_back(All_Of_Humans,&New_Nurse);
        pbVar6 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar5 = temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          paVar11 = &(temp.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_2;
          do {
            plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (paVar11 + -1))->_M_dataplus)._M_p;
            if (paVar11 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar4) {
              operator_delete(plVar4,paVar11->_M_allocated_capacity + 1);
            }
            pbVar10 = (pointer)(paVar11 + 1);
            paVar11 = paVar11 + 2;
          } while (pbVar10 != pbVar6);
          temp.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Visited_Patients._M_dataplus._M_p != paVar13) {
          operator_delete(New_Nurse.Visited_Patients._M_dataplus._M_p,
                          New_Nurse.Visited_Patients.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Field._M_dataplus._M_p != paVar12) {
          operator_delete(New_Nurse.Field._M_dataplus._M_p,
                          New_Nurse.Field.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Time._M_dataplus._M_p != paVar1) {
          operator_delete(New_Nurse.Time._M_dataplus._M_p,
                          New_Nurse.Time.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)New_Nurse.Day._M_dataplus._M_p != paVar2) {
          operator_delete(New_Nurse.Day._M_dataplus._M_p,
                          New_Nurse.Day.field_2._M_allocated_capacity + 1);
        }
LAB_00121e36:
        Human::~Human(&New_Nurse.super_Human);
        iVar9 = -1;
      }
      else {
        lVar7 = std::__cxx11::string::find((char *)&s,0x12a889,0);
        if (iVar9 == 10 && lVar7 != -1) {
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          pcVar3 = ((temp.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_228,pcVar3,
                     pcVar3 + (temp.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_248,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3c8,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_3e8,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
          local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_408,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
          local_428[0] = local_418;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_428,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
          local_448[0] = local_438;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_448,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
          local_468[0] = local_458;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_468,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
          local_488[0] = local_478;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_488,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[8]._M_string_length);
          local_4a8[0] = local_498;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[9]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4a8,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[9]._M_string_length);
          local_268[0] = local_258;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[10]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_268,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[10]._M_string_length);
          password_00._M_string_length = (size_type)local_448;
          password_00._M_dataplus._M_p = (pointer)local_428;
          password_00.field_2._M_allocated_capacity = (size_type)local_468;
          password_00.field_2._8_8_ = local_488;
          age_00._M_string_length = (size_type)local_268;
          age_00._M_dataplus._M_p = (pointer)local_4a8;
          age_00.field_2._M_allocated_capacity =
               (size_type)
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          age_00.field_2._8_8_ =
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          field_00._M_string_length = uStack_640;
          field_00._M_dataplus._M_p =
               (pointer)temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          field_00.field_2._M_allocated_capacity = (size_type)paVar2;
          field_00.field_2._8_8_ = paVar1;
          day_00._M_string_length = (size_type)paVar13;
          day_00._M_dataplus._M_p = (pointer)paVar12;
          day_00.field_2._M_allocated_capacity = (size_type)this_00;
          day_00.field_2._8_8_ = All_Of_Humans;
          time_00._M_string_length = in_stack_fffffffffffffa00;
          time_00._M_dataplus._M_p = in_stack_fffffffffffff9f8;
          time_00.field_2._M_allocated_capacity = in_stack_fffffffffffffa08;
          time_00.field_2._8_8_ = in_stack_fffffffffffffa10;
          visited_patients_00._M_string_length = s._M_string_length;
          visited_patients_00._M_dataplus._M_p = s._M_dataplus._M_p;
          visited_patients_00.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity;
          visited_patients_00.field_2._8_8_ = s.field_2._8_8_;
          Doctor::Doctor(&New_Nurse,&local_228,&local_248,&local_3c8,&local_3e8,&local_408,
                         password_00,age_00,field_00,day_00,time_00,visited_patients_00);
          if (local_268[0] != local_258) {
            operator_delete(local_268[0],local_258[0] + 1);
          }
          if (local_4a8[0] != local_498) {
            operator_delete(local_4a8[0],local_498[0] + 1);
          }
          if (local_488[0] != local_478) {
            operator_delete(local_488[0],local_478[0] + 1);
          }
          if (local_468[0] != local_458) {
            operator_delete(local_468[0],local_458[0] + 1);
          }
          if (local_448[0] != local_438) {
            operator_delete(local_448[0],local_438[0] + 1);
          }
          if (local_428[0] != local_418) {
            operator_delete(local_428[0],local_418[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
            operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          std::vector<Doctor,_std::allocator<Doctor>_>::push_back(All_Of_Humans,&New_Nurse);
          pbVar6 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar11 = &(temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar11 + -1))->_M_dataplus)._M_p;
              if (paVar11 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
                operator_delete(plVar4,paVar11->_M_allocated_capacity + 1);
              }
              pbVar10 = (pointer)(paVar11 + 1);
              paVar11 = paVar11 + 2;
            } while (pbVar10 != pbVar6);
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Visited_Patients._M_dataplus._M_p != paVar13) {
            operator_delete(New_Nurse.Visited_Patients._M_dataplus._M_p,
                            New_Nurse.Visited_Patients.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Field._M_dataplus._M_p != paVar12) {
            operator_delete(New_Nurse.Field._M_dataplus._M_p,
                            New_Nurse.Field.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Time._M_dataplus._M_p != paVar1) {
            operator_delete(New_Nurse.Time._M_dataplus._M_p,
                            New_Nurse.Time.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Day._M_dataplus._M_p != paVar2) {
            operator_delete(New_Nurse.Day._M_dataplus._M_p,
                            New_Nurse.Day.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00121e36;
        }
        lVar7 = std::__cxx11::string::find((char *)&s,0x12a890,0);
        if (iVar9 == 7 && lVar7 != -1) {
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          pcVar3 = ((temp.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_288,pcVar3,
                     pcVar3 + (temp.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4c8,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e8,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length);
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_508,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[3]._M_string_length);
          local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_528,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length);
          local_548[0] = local_538;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_548,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[5]._M_string_length);
          local_568[0] = local_558;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_568,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[6]._M_string_length);
          local_588[0] = local_578;
          pcVar3 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_588,pcVar3,
                     pcVar3 + temp.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[7]._M_string_length);
          local_5a8[0] = local_598;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"salam1","");
          local_5c8[0] = local_5b8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"salam1","");
          local_2a8[0] = local_298;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"salam2","");
          password_01._M_string_length = (size_type)local_568;
          password_01._M_dataplus._M_p = (pointer)local_548;
          password_01.field_2._M_allocated_capacity = (size_type)local_588;
          password_01.field_2._8_8_ = local_5a8;
          age_01._M_string_length = (size_type)local_2a8;
          age_01._M_dataplus._M_p = (pointer)local_5c8;
          age_01.field_2._M_allocated_capacity =
               (size_type)
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          age_01.field_2._8_8_ =
               temp.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          field_01._M_string_length = uStack_640;
          field_01._M_dataplus._M_p =
               (pointer)temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          field_01.field_2._M_allocated_capacity = (size_type)paVar2;
          field_01.field_2._8_8_ = paVar1;
          day_01._M_string_length = (size_type)paVar13;
          day_01._M_dataplus._M_p = (pointer)paVar12;
          day_01.field_2._M_allocated_capacity = (size_type)this_00;
          day_01.field_2._8_8_ = All_Of_Humans;
          time_01._M_string_length = in_stack_fffffffffffffa00;
          time_01._M_dataplus._M_p = in_stack_fffffffffffff9f8;
          time_01.field_2._M_allocated_capacity = in_stack_fffffffffffffa08;
          time_01.field_2._8_8_ = in_stack_fffffffffffffa10;
          visited_patients_01._M_string_length = s._M_string_length;
          visited_patients_01._M_dataplus._M_p = s._M_dataplus._M_p;
          visited_patients_01.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity;
          visited_patients_01.field_2._8_8_ = s.field_2._8_8_;
          Doctor::Doctor(&New_Nurse,&local_288,&local_4c8,&local_4e8,&local_508,&local_528,
                         password_01,age_01,field_01,day_01,time_01,visited_patients_01);
          if (local_2a8[0] != local_298) {
            operator_delete(local_2a8[0],local_298[0] + 1);
          }
          if (local_5c8[0] != local_5b8) {
            operator_delete(local_5c8[0],local_5b8[0] + 1);
          }
          if (local_5a8[0] != local_598) {
            operator_delete(local_5a8[0],local_598[0] + 1);
          }
          if (local_588[0] != local_578) {
            operator_delete(local_588[0],local_578[0] + 1);
          }
          if (local_568[0] != local_558) {
            operator_delete(local_568[0],local_558[0] + 1);
          }
          if (local_548[0] != local_538) {
            operator_delete(local_548[0],local_538[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._M_dataplus._M_p != &local_528.field_2) {
            operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_508._M_dataplus._M_p != &local_508.field_2) {
            operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
            operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
            operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
          std::vector<Doctor,_std::allocator<Doctor>_>::push_back(All_Of_Humans,&New_Nurse);
          pbVar6 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = temp.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              temp.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar11 = &(temp.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar11 + -1))->_M_dataplus)._M_p;
              if (paVar11 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar4) {
                operator_delete(plVar4,paVar11->_M_allocated_capacity + 1);
              }
              pbVar10 = (pointer)(paVar11 + 1);
              paVar11 = paVar11 + 2;
            } while (pbVar10 != pbVar6);
            temp.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar5;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(this_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Visited_Patients._M_dataplus._M_p != paVar13) {
            operator_delete(New_Nurse.Visited_Patients._M_dataplus._M_p,
                            New_Nurse.Visited_Patients.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Field._M_dataplus._M_p != paVar12) {
            operator_delete(New_Nurse.Field._M_dataplus._M_p,
                            New_Nurse.Field.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Time._M_dataplus._M_p != paVar1) {
            operator_delete(New_Nurse.Time._M_dataplus._M_p,
                            New_Nurse.Time.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)New_Nurse.Day._M_dataplus._M_p != paVar2) {
            operator_delete(New_Nurse.Day._M_dataplus._M_p,
                            New_Nurse.Day.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00121e36;
        }
      }
      iVar9 = iVar9 + 1;
    } while (((byte)inFile[*(long *)(*(long *)inFile + -0x18) + 0x20] & 2) == 0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)s._M_dataplus._M_p != &s.field_2) {
    operator_delete(s._M_dataplus._M_p,s.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&temp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)item._M_dataplus._M_p != &item.field_2) {
    operator_delete(item._M_dataplus._M_p,
                    CONCAT71(item.field_2._M_allocated_capacity._1_7_,item.field_2._M_local_buf[0])
                    + 1);
  }
  return;
}

Assistant:

void Hospital::Read_From_File_And_Create_Objects (vector<T>& All_Of_Humans , fstream& inFile){

    if (inFile.fail()){
        cerr << "Error opening file !!! " <<endl;
        exit(1) ;
    }

    int counter = 0 ;
    string item;
    vector<string>temp;
    string s=typeid(T).name();
    while(!inFile.eof()){

        inFile >> item ;
        temp.push_back(item);
        if(s.find("Nurse")!=string::npos && counter == 9){

            T New_Nurse(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                        temp[9] ,"salam");
            All_Of_Humans.push_back(New_Nurse);
            temp.clear();
            counter = -1;

        }
        else if(s.find("Doctor")!=string::npos  && counter == 10) {

            T New_Doctor(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7], temp[8],
                         temp[9], temp[10] );

            All_Of_Humans.push_back(New_Doctor);
            temp.clear();
            counter =-1;

        }
        else if (s.find("Patient")!=string::npos  && counter == 7) {

            T New_Patient(temp[0], temp[1], temp[2], temp[3], temp[4], temp[5], temp[6], temp[7],"salam1","salam1","salam2"
            );
            All_Of_Humans.push_back(New_Patient);
            temp.clear();
            counter = -1;
        }

        counter++;

    }
}